

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void trompeloeil::print_mismatch<bool,int>(ostream *os,size_t num,bool *v,int *p)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefix;
  size_type *local_68;
  size_type local_58;
  undefined8 uStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*p != (uint)*v) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_48,"_");
    local_68 = (size_type *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68 == paVar4) {
      local_58 = paVar4->_M_allocated_capacity;
      uStack_50 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_68 = &local_58;
    }
    else {
      local_58 = paVar4->_M_allocated_capacity;
    }
    sVar1 = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected ",0xb);
    *(ulong *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (ulong)(num < 9) + 1;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_68,sVar1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    print_expectation<bool>(os,v);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
  }
  return;
}

Assistant:

bool
  param_matches_impl(
    T const& t,
    U const& u,
    void const*)
  noexcept(noexcept(::trompeloeil::identity<U>(t) == u))
  {
    return ::trompeloeil::identity<U>(t) == u;
  }